

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall
SerialExecutionQueue::executeProcess
          (SerialExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> completionFn,
          ProcessDelegate *delegate)

{
  char *__s;
  ProcessHandle handle;
  ProcessContext *ctx;
  POSIXEnvironment environment_00;
  ProcessAttributes attr;
  StringRef value;
  _Any_data *p_Var1;
  size_type sVar2;
  iterator __begin1;
  long lVar3;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  char **ppcVar5;
  StringRef key;
  StringRef key_00;
  undefined8 uStack_1c0;
  ProcessReleaseFn releaseFn;
  pair<llvm::StringRef,_llvm::StringRef> pair;
  ProcessCompletionFn *in_stack_fffffffffffffea0;
  undefined4 uStack_154;
  ProcessCompletionFn laneCompletionFn;
  POSIXEnvironment posixEnv;
  POSIXEnvironment local_a0;
  
  ppVar4 = environment.Data;
  sVar2 = commandLine.Length;
  if (((this->cancelled)._M_base._M_i & 1U) == 0) {
    posixEnv.keys._M_h._M_buckets = &posixEnv.keys._M_h._M_single_bucket;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    posixEnv.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    posixEnv.keys._M_h._M_element_count = 0;
    posixEnv.keys._M_h._M_bucket_count = 1;
    posixEnv.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    posixEnv.keys._M_h._M_rehash_policy._4_4_ = 0;
    posixEnv.keys._M_h._M_rehash_policy._M_next_resize = 0;
    posixEnv.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    posixEnv.isFrozen = false;
    releaseFn.super__Function_base._M_functor._0_4_ = this->buildID;
    releaseFn.super__Function_base._M_manager._0_2_ = 0x109;
    llvm::Twine::str_abi_cxx11_((string *)&pair,(Twine *)&releaseFn);
    key.Length = 0x10;
    key.Data = "LLBUILD_BUILD_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,key,pair.first);
    std::__cxx11::string::_M_dispose();
    releaseFn.super__Function_base._M_manager._0_2_ = 0x10a;
    releaseFn.super__Function_base._M_functor._0_4_ = 0;
    llvm::Twine::str_abi_cxx11_((string *)&pair,(Twine *)&releaseFn);
    key_00.Length = 0xf;
    key_00.Data = "LLBUILD_LANE_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,key_00,pair.first);
    std::__cxx11::string::_M_dispose();
    for (lVar3 = environment.Length << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
      llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,ppVar4->first,ppVar4->second);
      ppVar4 = ppVar4 + 1;
    }
    if (attributes.inheritEnvironment != false) {
      for (ppcVar5 = this->environment; __s = *ppcVar5, __s != (char *)0x0; ppcVar5 = ppcVar5 + 1) {
        releaseFn.super__Function_base._M_functor._0_4_ = SUB84(__s,0);
        releaseFn.super__Function_base._M_functor._4_4_ = (undefined4)((ulong)__s >> 0x20);
        releaseFn.super__Function_base._M_functor._8_8_ = strlen(__s);
        llvm::StringRef::split(&pair,(StringRef *)&releaseFn,'=');
        value.Length = pair.second.Length;
        value.Data = pair.second.Data;
        llbuild::basic::POSIXEnvironment::setIfMissing(&posixEnv,pair.first,value);
      }
    }
    handle.id = (uint64_t)opaqueContext[1]._vptr_QueueJobContext;
    releaseFn.super__Function_base._M_functor._0_4_ = 0;
    releaseFn.super__Function_base._M_functor._4_4_ = 0;
    releaseFn.super__Function_base._M_functor._8_8_ = 0;
    releaseFn._M_invoker =
         std::
         _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:303:34)>
         ::_M_invoke;
    releaseFn.super__Function_base._M_manager._0_2_ = 0x4528;
    releaseFn.super__Function_base._M_manager._2_6_ = 0x1a;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)&pair,
               (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
    std::function<void(llbuild::basic::ProcessResult)>::
    function<SerialExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)::_lambda(llbuild::basic::ProcessResult)_1_,void>
              ((function<void(llbuild::basic::ProcessResult)> *)&laneCompletionFn,
               (anon_class_40_1_0860c3c2 *)&pair);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)&pair)
    ;
    if (completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_ == 0) {
      completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_ =
           (this->super_ExecutionQueue).delegate;
    }
    ctx = (ProcessContext *)*opaqueContext[2]._vptr_QueueJobContext;
    llbuild::basic::POSIXEnvironment::POSIXEnvironment(&local_a0,&posixEnv);
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)attributes._0_8_;
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_a0;
    environment_00.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)attributes.workingDir.Data;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)attributes.workingDir.Length;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)attributes._24_8_;
    environment_00.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&releaseFn;
    environment_00.keys._M_h._M_buckets = (__buckets_ptr)&laneCompletionFn;
    environment_00.keys._M_h._M_bucket_count = uStack_1c0;
    environment_00.keys._M_h._M_before_begin._M_nxt._0_4_ =
         releaseFn.super__Function_base._M_functor._0_4_;
    environment_00.keys._M_h._M_before_begin._M_nxt._4_4_ =
         releaseFn.super__Function_base._M_functor._4_4_;
    environment_00.keys._M_h._M_element_count = releaseFn.super__Function_base._M_functor._8_8_;
    environment_00.keys._M_h._M_rehash_policy._M_max_load_factor._0_2_ =
         releaseFn.super__Function_base._M_manager._0_2_;
    environment_00.keys._M_h._M_rehash_policy._2_6_ =
         releaseFn.super__Function_base._M_manager._2_6_;
    environment_00.keys._M_h._M_rehash_policy._M_next_resize = (size_t)releaseFn._M_invoker;
    environment_00.keys._M_h._M_single_bucket = (__node_base_ptr)opaqueContext;
    environment_00._104_8_ = commandLine.Data;
    attr.workingDir = pair.first;
    attr.canSafelyInterrupt = (bool)(char)sVar2;
    attr.connectToConsole = (bool)(char)(sVar2 >> 8);
    attr._2_6_ = (int6)(sVar2 >> 0x10);
    attr._24_8_ = pair.second.Data;
    llbuild::basic::spawnProcess
              ((ProcessDelegate *)
               completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._8_8_,ctx,
               &this->spawnedProcesses,handle,commandLine,environment_00,attr,
               (ProcessReleaseFn *)pair.second.Length,in_stack_fffffffffffffea0);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_a0);
    if (laneCompletionFn.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*laneCompletionFn.super__Function_base._M_manager)
                ((_Any_data *)&laneCompletionFn,(_Any_data *)&laneCompletionFn,__destroy_functor);
    }
    if ((code *)CONCAT62(releaseFn.super__Function_base._M_manager._2_6_,
                         releaseFn.super__Function_base._M_manager._0_2_) != (code *)0x0) {
      (*(code *)CONCAT62(releaseFn.super__Function_base._M_manager._2_6_,
                         releaseFn.super__Function_base._M_manager._0_2_))(&releaseFn,&releaseFn,3);
    }
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&posixEnv);
  }
  else if (*(char *)(completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                    0x20) == '\x01') {
    p_Var1 = (_Any_data *)
             llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                       ((Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)
                        completionFn.Storage.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_)
    ;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xffffffff00000002;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_154,0xffffffff);
    posixEnv.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    posixEnv.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (*(long *)(p_Var1 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(p_Var1->_M_pod_data + 0x18))(p_Var1,(ProcessResult *)&posixEnv);
  }
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    SerialContext& context = *reinterpret_cast<SerialContext*>(opaqueContext);

    // Do not execute new processes anymore after cancellation.
    if (cancelled) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessResult::makeCancelled());
      return;
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(0).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [](std::function<void()>&& processWait) {
      // not allowed to release, call wait directly
      processWait();
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn](ProcessResult result) mutable {
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }